

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O2

void __thiscall
chrono::ChFile_ps::DrawRectangle
          (ChFile_ps *this,ChVector2<double> *mfrom,ChVector2<double> *mwh,Space space,bool filled)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined3 in_register_00000081;
  double dVar4;
  double dVar5;
  undefined1 local_a8 [16];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  undefined1 local_70 [32];
  double local_50 [2];
  undefined1 local_40 [32];
  
  dVar1 = mfrom->m_data[0];
  dVar2 = mwh->m_data[0];
  dVar4 = dVar1 + dVar2;
  dVar5 = mfrom->m_data[1] + mwh->m_data[1];
  GrSave(this);
  StartLine(this);
  local_88 = mfrom->m_data[0];
  dStack_80 = mfrom->m_data[1];
  TransPt((ChFile_ps *)(local_40 + 0x10),(ChVector2<double> *)this,(Space)&local_88);
  MoveTo(this,(ChVector2<double> *)(local_40 + 0x10));
  local_50[0] = dVar1 + dVar2;
  local_50[1] = 0.0;
  TransPt((ChFile_ps *)local_40,(ChVector2<double> *)this,(Space)local_50);
  AddLinePoint(this,(ChVector2<double> *)local_40);
  local_98 = dVar4;
  dStack_90 = dVar5;
  TransPt((ChFile_ps *)(local_70 + 0x10),(ChVector2<double> *)this,(Space)&local_98);
  AddLinePoint(this,(ChVector2<double> *)(local_70 + 0x10));
  auVar3._8_8_ = dVar5;
  auVar3._0_8_ = dVar4;
  local_a8 = vmovlps_avx(auVar3,dVar1);
  TransPt((ChFile_ps *)local_70,(ChVector2<double> *)this,(Space)local_a8);
  AddLinePoint(this,(ChVector2<double> *)local_70);
  CloseLine(this);
  if (CONCAT31(in_register_00000081,filled) == 0) {
    PaintStroke(this);
  }
  else {
    PaintFill(this);
  }
  GrRestore(this);
  return;
}

Assistant:

void ChFile_ps::DrawRectangle(ChVector2<> mfrom, ChVector2<> mwh, Space space, bool filled) {
    ChVector2<> mp1, mp2, mp3;
    mp1.x() = mfrom.x() + mwh.x();
    mp1.y() = mfrom.y();
    mp2.x() = mfrom.x() + mwh.x();
    mp2.y() = mfrom.y() + mwh.y();
    mp3.x() = mfrom.x();
    mp3.y() = mfrom.y() + mwh.y();
    GrSave();
    StartLine();
    MoveTo(TransPt(mfrom, space));
    AddLinePoint(TransPt(mp1, space));
    AddLinePoint(TransPt(mp2, space));
    AddLinePoint(TransPt(mp3, space));
    CloseLine();
    if (filled)
        PaintFill();
    else
        PaintStroke();
    GrRestore();
}